

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetClipboardTextFn_DefaultImpl(char *text)

{
  ImGuiContext *pIVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *text_end;
  ImGuiContext *g;
  char *text_local;
  
  pIVar1 = GImGui;
  if (GImGui->PrivateClipboard != (char *)0x0) {
    ImGui::MemFree(GImGui->PrivateClipboard);
    pIVar1->PrivateClipboard = (char *)0x0;
  }
  sVar2 = strlen(text);
  pcVar3 = text + sVar2;
  pcVar4 = (char *)ImGui::MemAlloc((size_t)(pcVar3 + (1 - (long)text)));
  pIVar1->PrivateClipboard = pcVar4;
  memcpy(pIVar1->PrivateClipboard,text,(long)pcVar3 - (long)text);
  pIVar1->PrivateClipboard[(int)pcVar3 - (int)text] = '\0';
  return;
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(const char* text)
{
    ImGuiContext& g = *GImGui;
    if (g.PrivateClipboard)
    {
        ImGui::MemFree(g.PrivateClipboard);
        g.PrivateClipboard = NULL;
    }
    const char* text_end = text + strlen(text);
    g.PrivateClipboard = (char*)ImGui::MemAlloc((size_t)(text_end - text) + 1);
    memcpy(g.PrivateClipboard, text, (size_t)(text_end - text));
    g.PrivateClipboard[(int)(text_end - text)] = 0;
}